

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SavepointMethod(sqlite3_vtab *pVtab,int iSavepoint)

{
  int local_18;
  int rc;
  int iSavepoint_local;
  sqlite3_vtab *pVtab_local;
  
  local_18 = 0;
  if (*(char *)&pVtab[0x13].pModule == '\0') {
    local_18 = fts3SyncMethod(pVtab);
  }
  return local_18;
}

Assistant:

static int fts3SavepointMethod(sqlite3_vtab *pVtab, int iSavepoint){
  int rc = SQLITE_OK;
  UNUSED_PARAMETER(iSavepoint);
  assert( ((Fts3Table *)pVtab)->inTransaction );
  assert( ((Fts3Table *)pVtab)->mxSavepoint <= iSavepoint );
  TESTONLY( ((Fts3Table *)pVtab)->mxSavepoint = iSavepoint );
  if( ((Fts3Table *)pVtab)->bIgnoreSavepoint==0 ){
    rc = fts3SyncMethod(pVtab);
  }
  return rc;
}